

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall
testing::internal::MaxBipartiteMatchState::~MaxBipartiteMatchState(MaxBipartiteMatchState *this)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *unaff_retaddr;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(unaff_retaddr);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

explicit MaxBipartiteMatchState(const MatchMatrix& graph)
      : graph_(&graph),
        left_(graph_->LhsSize(), kUnused),
        right_(graph_->RhsSize(), kUnused) {
  }